

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdBindDescriptorSets
          (CommandBuffer *this,
          vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
          *descriptor_sets,uint32_t first_set,Ptr<PipelineLayout> *pipeline_layout,
          VkPipelineBindPoint pipeline_bind_point,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *offsets)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdBindDescriptorSets p_Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_type sVar5;
  element_type *this_00;
  VkDescriptorSet pVVar6;
  reference ppVVar7;
  element_type *this_01;
  VkPipelineLayout pVVar8;
  VkDescriptorSet_T **ppVVar9;
  uint *puVar10;
  uint32_t in_EDX;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_RSI;
  long in_RDI;
  VkPipelineBindPoint in_R8D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  uint32_t i;
  vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_> handles;
  allocator_type *in_stack_ffffffffffffff30;
  vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_> *this_02;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint local_68;
  allocator<VkDescriptorSet_T_*> local_51;
  vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  VkPipelineBindPoint local_2c;
  uint32_t local_1c;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *local_18;
  
  local_38 = in_R9;
  local_2c = in_R8D;
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::size(in_RSI);
  std::allocator<VkDescriptorSet_T_*>::allocator((allocator<VkDescriptorSet_T_*> *)0x2ac6c8);
  std::vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::vector
            ((vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_stack_ffffffffffffff30
            );
  std::allocator<VkDescriptorSet_T_*>::~allocator(&local_51);
  local_68 = 0;
  while( true ) {
    sVar5 = std::vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::size(&local_50);
    p_Var2 = vkCmdBindDescriptorSets;
    if (sVar5 <= local_68) break;
    std::
    vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
    ::operator[](local_18,(ulong)local_68);
    this_00 = std::
              __shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2ac741);
    pVVar6 = DescriptorSet::GetHandle(this_00);
    ppVVar7 = std::vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::operator[]
                        (&local_50,(ulong)local_68);
    *ppVVar7 = pVVar6;
    local_68 = local_68 + 1;
  }
  pVVar1 = *(VkCommandBuffer *)(in_RDI + 0x28);
  this_01 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2ac805);
  pVVar8 = PipelineLayout::GetHandle(this_01);
  this_02 = &local_50;
  sVar5 = std::vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::size(this_02);
  uVar3 = (uint32_t)sVar5;
  ppVVar9 = std::vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::data
                      ((vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_> *)0x2ac83f
                      );
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_38);
  uVar4 = (uint32_t)sVar5;
  puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2ac862);
  (*p_Var2)(pVVar1,local_2c,pVVar8,local_1c,uVar3,ppVVar9,uVar4,puVar10);
  std::vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::~vector(this_02);
  return;
}

Assistant:

void CommandBuffer::CmdBindDescriptorSets(const std::vector<Ptr<DescriptorSet>> &descriptor_sets, uint32_t first_set,
                                          const Ptr<PipelineLayout> &pipeline_layout,
                                          VkPipelineBindPoint pipeline_bind_point,
                                          const std::vector<uint32_t> &offsets) const {
	std::vector<VkDescriptorSet> handles(descriptor_sets.size());
	for (uint32_t i = 0; i < handles.size(); ++i)
		handles[i] = descriptor_sets[i]->GetHandle();

	vkCmdBindDescriptorSets(m_command_buffer, pipeline_bind_point, pipeline_layout->GetHandle(), first_set,
	                        handles.size(), handles.data(), offsets.size(), offsets.data());
}